

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * MemBackendRealloc(SyMemBackend *pBackend,void *pOld,sxu32 nByte)

{
  undefined8 *puVar1;
  SyMemBlock *pSVar2;
  int iVar3;
  SyMemBlock *pSVar4;
  SyMemBlock *pSVar5;
  uint local_4c;
  sxu32 nRetry;
  SyMemBlock *pNext;
  SyMemBlock *pPrev;
  SyMemBlock *pNew;
  SyMemBlock *pBlock;
  sxu32 nByte_local;
  void *pOld_local;
  SyMemBackend *pBackend_local;
  
  local_4c = 0;
  if (pOld == (void *)0x0) {
    pBackend_local = (SyMemBackend *)MemBackendAlloc(pBackend,nByte);
  }
  else {
    pSVar4 = (SyMemBlock *)((long)pOld + -0x10);
    puVar1 = *(undefined8 **)((long)pOld + -8);
    pSVar2 = pSVar4->pNext;
    while ((((pSVar5 = (SyMemBlock *)(*pBackend->pMethods->xRealloc)(pSVar4,nByte + 0x10),
             pSVar5 == (SyMemBlock *)0x0 && (pBackend->xMemError != (ProcMemError)0x0)) &&
            (local_4c < 4)) && (iVar3 = (*pBackend->xMemError)(pBackend->pUserData), iVar3 == -0x21)
           )) {
      local_4c = local_4c + 1;
    }
    if (pSVar5 == (SyMemBlock *)0x0) {
      pBackend_local = (SyMemBackend *)0x0;
    }
    else {
      if (pSVar5 != pSVar4) {
        if (puVar1 == (undefined8 *)0x0) {
          pBackend->pBlocks = pSVar5;
        }
        else {
          *puVar1 = pSVar5;
        }
        if (pSVar2 != (SyMemBlock *)0x0) {
          pSVar2->pPrev = pSVar5;
        }
      }
      pBackend_local = (SyMemBackend *)(pSVar5 + 1);
    }
  }
  return pBackend_local;
}

Assistant:

static void * MemBackendRealloc(SyMemBackend *pBackend, void * pOld, sxu32 nByte)
{
	SyMemBlock *pBlock, *pNew, *pPrev, *pNext;
	sxu32 nRetry = 0;

	if( pOld == 0 ){
		return MemBackendAlloc(&(*pBackend), nByte);
	}
	pBlock = (SyMemBlock *)(((char *)pOld) - sizeof(SyMemBlock));
#if defined(UNTRUST)
	if( pBlock->nGuard != SXMEM_BACKEND_MAGIC ){
		return 0;
	}
#endif
	nByte += sizeof(SyMemBlock);
	pPrev = pBlock->pPrev;
	pNext = pBlock->pNext;
	for(;;){
		pNew = (SyMemBlock *)pBackend->pMethods->xRealloc(pBlock, nByte);
		if( pNew != 0 || pBackend->xMemError == 0 || nRetry > SXMEM_BACKEND_RETRY ||
			SXERR_RETRY != pBackend->xMemError(pBackend->pUserData) ){
				break;
		}
		nRetry++;
	}
	if( pNew == 0 ){
		return 0;
	}
	if( pNew != pBlock ){
		if( pPrev == 0 ){
			pBackend->pBlocks = pNew;
		}else{
			pPrev->pNext = pNew;
		}
		if( pNext ){
			pNext->pPrev = pNew;
		}
#if defined(UNTRUST)
		pNew->nGuard = SXMEM_BACKEND_MAGIC;
#endif
	}
	return (void *)&pNew[1];
}